

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

bool __thiscall
cmOrderDirectoriesConstraintSOName::FindConflict
          (cmOrderDirectoriesConstraintSOName *this,string *dir)

{
  bool bVar1;
  ulong uVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar3;
  _Self local_68;
  const_iterator last;
  _Self local_50;
  const_iterator first;
  string base;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  string *dir_local;
  cmOrderDirectoriesConstraintSOName *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                      (&this->super_cmOrderDirectoriesConstraint,dir,&this->SOName);
    if (bVar1) {
      this_local._7_1_ = 1;
      goto LAB_008047d2;
    }
  }
  else {
    this_00 = cmGlobalGenerator::GetDirectoryContent
                        ((this->super_cmOrderDirectoriesConstraint).GlobalGenerator,dir,true);
    std::__cxx11::string::string
              ((string *)&first,(string *)&(this->super_cmOrderDirectoriesConstraint).FileName);
    local_50._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::lower_bound(this_00,(key_type *)&first);
    pcVar3 = (char *)std::__cxx11::string::back();
    *pcVar3 = *pcVar3 + '\x01';
    local_68._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::upper_bound(this_00,(key_type *)&first);
    bVar1 = std::operator!=(&local_50,&local_68);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)&first);
    if (bVar1) goto LAB_008047d2;
  }
  this_local._7_1_ = 0;
LAB_008047d2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmOrderDirectoriesConstraintSOName::FindConflict(std::string const& dir)
{
  // Determine which type of check to do.
  if (!this->SOName.empty()) {
    // We have the library soname.  Check if it will be found.
    if (this->FileMayConflict(dir, this->SOName)) {
      return true;
    }
  } else {
    // We do not have the soname.  Look for files in the directory
    // that may conflict.
    std::set<std::string> const& files =
      (this->GlobalGenerator->GetDirectoryContent(dir, true));

    // Get the set of files that might conflict.  Since we do not
    // know the soname just look at all files that start with the
    // file name.  Usually the soname starts with the library name.
    std::string base = this->FileName;
    auto first = files.lower_bound(base);
    ++base.back();
    auto last = files.upper_bound(base);
    if (first != last) {
      return true;
    }
  }
  return false;
}